

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cylinder.cpp
# Opt level: O0

void __thiscall
geometry::primitive::Cylinder::Cylinder
          (Cylinder *this,Matrix4d *transformation,shared_ptr<material::Material> *material,
          double minimum,double maximum,bool closed)

{
  shared_ptr<material::Material> local_48;
  byte local_31;
  double dStack_30;
  bool closed_local;
  double maximum_local;
  double minimum_local;
  shared_ptr<material::Material> *material_local;
  Matrix4d *transformation_local;
  Cylinder *this_local;
  
  local_31 = closed;
  dStack_30 = maximum;
  maximum_local = minimum;
  minimum_local = (double)material;
  material_local = (shared_ptr<material::Material> *)transformation;
  transformation_local = (Matrix4d *)this;
  std::shared_ptr<material::Material>::shared_ptr(&local_48,material);
  Primitive::Primitive(&this->super_Primitive,transformation,&local_48);
  std::shared_ptr<material::Material>::~shared_ptr(&local_48);
  (this->super_Primitive)._vptr_Primitive = (_func_int **)&PTR_transform_0012c7f0;
  this->m_minmax[0] = maximum_local;
  this->m_minmax[1] = dStack_30;
  this->m_closed = (bool)(local_31 & 1);
  return;
}

Assistant:

geometry::primitive::Cylinder::Cylinder(const math::Matrix4d &transformation, std::shared_ptr<material::Material> material, double minimum, double maximum, bool closed) :
    Primitive(transformation, material),
    m_minmax{minimum, maximum},
    m_closed{closed}
{}